

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

_Bool fnet_socket_select(fnet_socket_t *sockets,size_t num,fnet_socket_t *rs,size_t *rs_num,
                        fnet_socket_t *es,size_t *es_num,size_t msec)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  fd_set *__exceptfds;
  size_t sVar3;
  size_t sVar4;
  fd_set *__readfds;
  uint uVar5;
  uint uVar6;
  timeval *__timeout;
  fd_set readfds;
  fd_set local_148;
  fd_set local_c8;
  timeval local_40;
  
  __exceptfds = &local_148;
  if (((num == 0 || sockets == (fnet_socket_t *)0x0) ||
      (rs == (fnet_socket_t *)0x0 && es == (fnet_socket_t *)0x0)) ||
     (rs != (fnet_socket_t *)0x0 && rs_num == (size_t *)0x0)) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    if (es == (fnet_socket_t *)0x0 || es_num != (size_t *)0x0) {
      sVar2 = 0;
      do {
        uVar5 = sockets[sVar2];
        if (sockets[sVar2] < uVar6) {
          uVar5 = uVar6;
        }
        sVar2 = sVar2 + 1;
        uVar6 = uVar5;
      } while (num != sVar2);
      if (rs != (fnet_socket_t *)0x0) {
        local_c8.fds_bits[0xe] = 0;
        local_c8.fds_bits[0xf] = 0;
        local_c8.fds_bits[0xc] = 0;
        local_c8.fds_bits[0xd] = 0;
        local_c8.fds_bits[10] = 0;
        local_c8.fds_bits[0xb] = 0;
        local_c8.fds_bits[8] = 0;
        local_c8.fds_bits[9] = 0;
        local_c8.fds_bits[6] = 0;
        local_c8.fds_bits[7] = 0;
        local_c8.fds_bits[4] = 0;
        local_c8.fds_bits[5] = 0;
        local_c8.fds_bits[2] = 0;
        local_c8.fds_bits[3] = 0;
        local_c8.fds_bits[0] = 0;
        local_c8.fds_bits[1] = 0;
        sVar2 = 0;
        do {
          local_c8.fds_bits[sockets[sVar2] >> 6] =
               local_c8.fds_bits[sockets[sVar2] >> 6] | 1L << ((byte)sockets[sVar2] & 0x3f);
          sVar2 = sVar2 + 1;
        } while (num != sVar2);
        *rs_num = 0;
      }
      if (es != (fnet_socket_t *)0x0) {
        local_148.fds_bits[0xe] = 0;
        local_148.fds_bits[0xf] = 0;
        local_148.fds_bits[0xc] = 0;
        local_148.fds_bits[0xd] = 0;
        local_148.fds_bits[10] = 0;
        local_148.fds_bits[0xb] = 0;
        local_148.fds_bits[8] = 0;
        local_148.fds_bits[9] = 0;
        local_148.fds_bits[6] = 0;
        local_148.fds_bits[7] = 0;
        local_148.fds_bits[4] = 0;
        local_148.fds_bits[5] = 0;
        local_148.fds_bits[2] = 0;
        local_148.fds_bits[3] = 0;
        local_148.fds_bits[0] = 0;
        local_148.fds_bits[1] = 0;
        sVar2 = 0;
        do {
          local_148.fds_bits[sockets[sVar2] >> 6] =
               local_148.fds_bits[sockets[sVar2] >> 6] | 1L << ((byte)sockets[sVar2] & 0x3f);
          sVar2 = sVar2 + 1;
        } while (num != sVar2);
        *es_num = 0;
      }
      if (msec == 0xffffffffffffffff) {
        __timeout = (timeval *)0x0;
      }
      else {
        local_40.tv_sec = msec / 1000;
        local_40.tv_usec = (msec % 1000) * 1000;
        __timeout = &local_40;
      }
      __readfds = &local_c8;
      if (rs == (fnet_socket_t *)0x0) {
        __readfds = (fd_set *)0x0;
      }
      if (es == (fnet_socket_t *)0x0) {
        __exceptfds = (fd_set *)0x0;
      }
      iVar1 = select(uVar5 + 1,__readfds,(fd_set *)0x0,__exceptfds,__timeout);
      uVar6 = (uint)(-1 < iVar1);
      if (-1 < iVar1) {
        sVar4 = 0;
        sVar2 = 0;
        sVar3 = 0;
        do {
          if ((rs != (fnet_socket_t *)0x0) &&
             (uVar5 = sockets[sVar4],
             ((ulong)local_c8.fds_bits[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            rs[sVar3] = uVar5;
            sVar3 = sVar3 + 1;
          }
          if ((es != (fnet_socket_t *)0x0) &&
             (uVar5 = sockets[sVar4],
             ((ulong)local_148.fds_bits[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            es[sVar2] = uVar5;
            sVar2 = sVar2 + 1;
          }
          sVar4 = sVar4 + 1;
        } while (num != sVar4);
        if (rs_num != (size_t *)0x0) {
          *rs_num = sVar3;
        }
        if (es_num != (size_t *)0x0) {
          *es_num = sVar2;
        }
      }
    }
  }
  return SUB41(uVar6,0);
}

Assistant:

bool fnet_socket_select(fnet_socket_t *sockets,
                        size_t num,
                        fnet_socket_t *rs,
                        size_t *rs_num,
                        fnet_socket_t *es,
                        size_t *es_num,
                        size_t msec)
{
    if (!sockets || !num)   return false;
    if (!rs && !es)         return false;
    if (rs && !rs_num)      return false;
    if (es && !es_num)      return false;

    fd_set readfds;
    fd_set exceptfds;
    fnet_socket_t nfds = 0;

    for(size_t i = 0; i < num; ++i)
        nfds = nfds < sockets[i] ? sockets[i] : nfds;

    if (rs)
    {
        FD_ZERO(&readfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &readfds);
        *rs_num = 0;
    }

    if (es)
    {
        FD_ZERO(&exceptfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &exceptfds);
        *es_num = 0;
    }

    struct timeval timeout;
    if (msec != (size_t)-1)
        timeout = msec2timeval(msec);

    int ret = select(nfds + 1, rs ? &readfds : 0, 0, es ? &exceptfds : 0, msec != (size_t)-1 ? &timeout : 0);
    if (ret < 0)
    {
        FLOG_ERR("Socket waiting was failed");
        return false;
    }

    size_t rsi = 0;
    size_t esi = 0;

    for(size_t i = 0; i < num; ++i)
    {
        if (rs && FD_ISSET(sockets[i], &readfds))
            rs[rsi++] = sockets[i];
        if (es && FD_ISSET(sockets[i], &exceptfds))
            es[esi++] = sockets[i];
    }

    if (rs_num) *rs_num = rsi;
    if (es_num) *es_num = esi;
    return true;
}